

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * anon_unknown.dwarf_233176::CreateMemberAccess
                    (VmModule *module,SynBase *source,VmValue *ptr,VmValue *shift,
                    TypeBase *structType,InplaceStr name)

{
  VmInstruction *pVVar1;
  VmValue *unaff_RBX;
  VmType type;
  
  if ((ptr->type).type != VM_TYPE_POINTER) {
    __assert_fail("ptr->type.type == VM_TYPE_POINTER",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x220,
                  "VmValue *(anonymous namespace)::CreateMemberAccess(VmModule *, SynBase *, VmValue *, VmValue *, TypeBase *, InplaceStr)"
                 );
  }
  if (((shift->type).type == VM_TYPE_INT) && ((shift->type).size == 4)) {
    if (structType != (TypeBase *)0x0) {
      type.structType = (TypeBase *)0x22;
      type._0_8_ = structType;
      pVVar1 = CreateInstruction((anon_unknown_dwarf_233176 *)module,(VmModule *)source,
                                 (SynBase *)0x800000006,type,(VmInstructionType)ptr,shift,
                                 (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,unaff_RBX);
      (pVVar1->super_VmValue).comment.begin = name.begin;
      (pVVar1->super_VmValue).comment.end = name.end;
      return &pVVar1->super_VmValue;
    }
    __assert_fail("structType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.h"
                  ,0xcd,"static const VmType VmType::Pointer(TypeBase *)");
  }
  __assert_fail("shift->type == VmType::Int",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x221,
                "VmValue *(anonymous namespace)::CreateMemberAccess(VmModule *, SynBase *, VmValue *, VmValue *, TypeBase *, InplaceStr)"
               );
}

Assistant:

VmValue* CreateMemberAccess(VmModule *module, SynBase *source, VmValue *ptr, VmValue *shift, TypeBase *structType, InplaceStr name)
	{
		assert(ptr->type.type == VM_TYPE_POINTER);
		assert(shift->type == VmType::Int);

		VmInstruction *inst = CreateInstruction(module, source, VmType::Pointer(structType), VM_INST_ADD, ptr, shift);

		inst->comment = name;

		return inst;
	}